

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_basicAllocateWithTypeInstanceSizeAlignmentSlotCountIsBytesIsWeak
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  sysbvm_object_tuple_t *local_60;
  sysbvm_tuple_t result;
  _Bool isWeak;
  _Bool isBytes;
  size_t variableSize;
  size_t slotCount;
  size_t instanceSize;
  sysbvm_tuple_t *type;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 7) {
    sysbvm_error_argumentCountMismatch(7,argumentCount);
  }
  sVar3 = sysbvm_tuple_anySize_decode(arguments[1]);
  sVar4 = sysbvm_tuple_anySize_decode(arguments[3]);
  sVar5 = sysbvm_tuple_anySize_decode(arguments[4]);
  _Var1 = sysbvm_tuple_boolean_decode(arguments[5]);
  _Var2 = sysbvm_tuple_boolean_decode(arguments[6]);
  if (_Var1) {
    local_60 = sysbvm_context_allocateByteTuple(context,*arguments,sVar3 + sVar5);
  }
  else {
    local_60 = sysbvm_context_allocatePointerTuple(context,*arguments,sVar4 + sVar5);
  }
  if (_Var2) {
    sysbvm_tuple_markWeakObject((sysbvm_tuple_t)local_60);
  }
  return (sysbvm_tuple_t)local_60;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_basicAllocateWithTypeInstanceSizeAlignmentSlotCountIsBytesIsWeak(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 7) sysbvm_error_argumentCountMismatch(7, argumentCount);

    sysbvm_tuple_t *type = arguments + 0;
    size_t instanceSize = sysbvm_tuple_anySize_decode(arguments[1]);
    //sysbvm_tuple_t *instanceAlignment = arguments + 2;
    size_t slotCount = sysbvm_tuple_anySize_decode(arguments[3]);
    size_t variableSize = sysbvm_tuple_anySize_decode(arguments[4]);
    bool isBytes = sysbvm_tuple_boolean_decode(arguments[5]);
    bool isWeak = sysbvm_tuple_boolean_decode(arguments[6]);

    sysbvm_tuple_t result = isBytes
        ? (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, *type, instanceSize + variableSize)
        : (sysbvm_tuple_t)sysbvm_context_allocatePointerTuple(context, *type, slotCount + variableSize);

    if(isWeak)
        sysbvm_tuple_markWeakObject(result);
    
    return result;
}